

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O1

int dountrap(void)

{
  boolean bVar1;
  int iVar2;
  char *pcVar3;
  char *line;
  
  iVar2 = near_capacity();
  if (iVar2 < 3) {
    if (((youmonst.data == mons + 100 || youmonst.data == mons + 0x62) ||
         ((youmonst.data)->mflags1 & 0x2000) == 0) && ((youmonst.data)->mmove != '\0')) {
      if ((u.ustuck == (monst *)0x0) || (bVar1 = sticks(youmonst.data), bVar1 == '\0')) {
        if ((u.ustuck == (monst *)0x0) &&
           (((iVar2 = welded(uwep), iVar2 == 0 || ((byte)(uwep->oclass | 4U) != 6)) ||
            ((objects[uwep->otyp].field_0x11 & 1) == 0)))) {
          iVar2 = untrap('\0');
          return iVar2;
        }
        pcVar3 = body_part(6);
        pcVar3 = makeplural(pcVar3);
        line = "Your %s seem to be too busy for that.";
      }
      else {
        pcVar3 = mon_nam(u.ustuck);
        line = "You\'ll have to let go of %s first.";
      }
      pline(line,pcVar3);
      return 0;
    }
    pcVar3 = "And just how do you expect to do that?";
  }
  else {
    pcVar3 = "You\'re too strained to do that.";
  }
  pline(pcVar3);
  return 0;
}

Assistant:

int dountrap(void)
{
	if (near_capacity() >= HVY_ENCUMBER) {
	    pline("You're too strained to do that.");
	    return 0;
	}
	if ((nohands(youmonst.data) && !webmaker(youmonst.data)) || !youmonst.data->mmove) {
	    pline("And just how do you expect to do that?");
	    return 0;
	} else if (u.ustuck && sticks(youmonst.data)) {
	    pline("You'll have to let go of %s first.", mon_nam(u.ustuck));
	    return 0;
	}
	if (u.ustuck || (welded(uwep) && bimanual(uwep))) {
	    pline("Your %s seem to be too busy for that.",
		 makeplural(body_part(HAND)));
	    return 0;
	}
	return untrap(FALSE);
}